

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O2

idx_t duckdb::FindRangeBound<duckdb::GreaterThan,true>
                (WindowCursor *range_lo,WindowCursor *range_hi,idx_t order_begin,idx_t order_end,
                WindowBoundary range,WindowInputExpression *boundary,idx_t chunk_idx,
                FrameBounds *prev)

{
  PhysicalType PVar1;
  double dVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  char cVar6;
  bool bVar7;
  short sVar8;
  short sVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  OutOfRangeException *pOVar17;
  unsigned_long uVar18;
  unsigned_long uVar19;
  uint64_t uVar20;
  long lVar21;
  InternalException *this;
  ulong uVar22;
  long lVar23;
  float fVar25;
  hugeint_t hVar26;
  WindowColumnIterator<unsigned_long> WVar27;
  WindowColumnIterator<short> WVar28;
  WindowColumnIterator<unsigned_int> WVar29;
  WindowColumnIterator<signed_char> WVar30;
  WindowColumnIterator<unsigned_short> WVar31;
  WindowColumnIterator<unsigned_char> WVar32;
  WindowColumnIterator<int> WVar33;
  WindowColumnIterator<long> WVar34;
  WindowColumnIterator<duckdb::hugeint_t> WVar35;
  WindowColumnIterator<duckdb::interval_t> WVar36;
  WindowColumnIterator<double> WVar37;
  WindowColumnIterator<float> WVar38;
  WindowColumnIterator<duckdb::uhugeint_t> WVar39;
  WindowColumnIterator<unsigned_long> __last;
  WindowColumnIterator<short> __last_00;
  WindowColumnIterator<unsigned_int> __last_01;
  WindowColumnIterator<signed_char> __last_02;
  WindowColumnIterator<unsigned_short> __last_03;
  WindowColumnIterator<unsigned_char> __last_04;
  WindowColumnIterator<int> __last_05;
  WindowColumnIterator<long> __last_06;
  WindowColumnIterator<duckdb::hugeint_t> __last_07;
  WindowColumnIterator<duckdb::interval_t> __last_08;
  WindowColumnIterator<double> __last_09;
  WindowColumnIterator<float> __last_10;
  WindowColumnIterator<duckdb::uhugeint_t> __last_11;
  allocator local_99;
  interval_t first;
  uchar val;
  undefined1 auStack_77 [15];
  OperationCompare<unsigned_char,_duckdb::GreaterThan> comp;
  interval_t cur_val;
  idx_t iVar24;
  
  uVar20 = auStack_77._7_8_;
  PVar1 = boundary->ptype;
  iVar24 = order_begin;
  auStack_77._7_8_ = uVar20;
  switch(PVar1) {
  case UINT8:
    bVar3 = WindowInputExpression::GetCell<unsigned_char>(boundary,chunk_idx);
    val = bVar3;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      bVar4 = WindowCursor::GetCell<unsigned_char>(range_hi,0,order_end - 1);
      if (bVar3 < bVar4) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar4 = WindowCursor::GetCell<unsigned_char>(range_lo,0,order_begin);
      if (bVar4 < bVar3) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar16 = prev->start;
    if (uVar16 < prev->end) {
      if (uVar16 < order_end && order_begin <= uVar16) {
        bVar4 = WindowCursor::GetCell<unsigned_char>(range_lo,0,uVar16);
        if ((bVar3 <= bVar4) && (iVar24 = prev->start, bVar4 <= bVar3)) goto LAB_015cd6c3;
      }
      uVar16 = prev->end;
      bVar7 = order_begin < uVar16;
      order_begin = iVar24;
      if ((uVar16 < order_end && bVar7) &&
         (bVar4 = WindowCursor::GetCell<unsigned_char>(range_hi,0,uVar16 - 1), bVar4 <= bVar3)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(unsigned_char,_unsigned_char)>::function
              ((function<bool_(unsigned_char,_unsigned_char)> *)&first,
               &comp.super_function<bool_(unsigned_char,_unsigned_char)>);
    WVar32.pos = order_begin;
    WVar32.coll = range_lo;
    __last_04.pos = order_end;
    __last_04.coll = range_hi;
    WVar32 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_char>,unsigned_char,duckdb::OperationCompare<unsigned_char,duckdb::GreaterThan>>
                       (WVar32,__last_04,&val,
                        (OperationCompare<unsigned_char,_duckdb::GreaterThan> *)&first);
    iVar24 = WVar32.pos;
    break;
  case INT8:
    cVar5 = WindowInputExpression::GetCell<signed_char>(boundary,chunk_idx);
    val = cVar5;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      cVar6 = WindowCursor::GetCell<signed_char>(range_hi,0,order_end - 1);
      if (cVar5 < cVar6) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cVar6 = WindowCursor::GetCell<signed_char>(range_lo,0,order_begin);
      if (cVar6 < cVar5) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar16 = prev->start;
    if (uVar16 < prev->end) {
      if (((uVar16 < order_end && order_begin <= uVar16) &&
          (cVar6 = WindowCursor::GetCell<signed_char>(range_lo,0,uVar16), cVar5 <= cVar6)) &&
         (iVar24 = prev->start, cVar6 <= cVar5)) goto LAB_015cd6c3;
      uVar16 = prev->end;
      bVar7 = order_begin < uVar16;
      order_begin = iVar24;
      if ((uVar16 < order_end && bVar7) &&
         (cVar6 = WindowCursor::GetCell<signed_char>(range_hi,0,uVar16 - 1), cVar6 <= cVar5)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(signed_char,_signed_char)>::function
              ((function<bool_(signed_char,_signed_char)> *)&first,
               (function<bool_(signed_char,_signed_char)> *)&comp);
    WVar30.pos = order_begin;
    WVar30.coll = range_lo;
    __last_02.pos = order_end;
    __last_02.coll = range_hi;
    WVar30 = ::std::
             lower_bound<duckdb::WindowColumnIterator<signed_char>,signed_char,duckdb::OperationCompare<signed_char,duckdb::GreaterThan>>
                       (WVar30,__last_02,(char *)&val,
                        (OperationCompare<signed_char,_duckdb::GreaterThan> *)&first);
    iVar24 = WVar30.pos;
    break;
  case UINT16:
    uVar10 = WindowInputExpression::GetCell<unsigned_short>(boundary,chunk_idx);
    _val = uVar10;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar11 = WindowCursor::GetCell<unsigned_short>(range_hi,0,order_end - 1);
      if (uVar10 < uVar11) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar11 = WindowCursor::GetCell<unsigned_short>(range_lo,0,order_begin);
      if (uVar11 < uVar10) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar16 = prev->start;
    if (uVar16 < prev->end) {
      if (uVar16 < order_end && order_begin <= uVar16) {
        uVar11 = WindowCursor::GetCell<unsigned_short>(range_lo,0,uVar16);
        if ((uVar10 <= uVar11) && (iVar24 = prev->start, uVar11 <= uVar10)) goto LAB_015cd6c3;
      }
      uVar16 = prev->end;
      bVar7 = order_begin < uVar16;
      order_begin = iVar24;
      if ((uVar16 < order_end && bVar7) &&
         (uVar11 = WindowCursor::GetCell<unsigned_short>(range_hi,0,uVar16 - 1), uVar11 <= uVar10))
      {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(unsigned_short,_unsigned_short)>::function
              ((function<bool_(unsigned_short,_unsigned_short)> *)&first,
               (function<bool_(unsigned_short,_unsigned_short)> *)&comp);
    WVar31.pos = order_begin;
    WVar31.coll = range_lo;
    __last_03.pos = order_end;
    __last_03.coll = range_hi;
    WVar31 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_short>,unsigned_short,duckdb::OperationCompare<unsigned_short,duckdb::GreaterThan>>
                       (WVar31,__last_03,(unsigned_short *)&val,
                        (OperationCompare<unsigned_short,_duckdb::GreaterThan> *)&first);
    iVar24 = WVar31.pos;
    break;
  case INT16:
    sVar8 = WindowInputExpression::GetCell<short>(boundary,chunk_idx);
    _val = sVar8;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      sVar9 = WindowCursor::GetCell<short>(range_hi,0,order_end - 1);
      if (sVar8 < sVar9) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      sVar9 = WindowCursor::GetCell<short>(range_lo,0,order_begin);
      if (sVar9 < sVar8) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar16 = prev->start;
    if (uVar16 < prev->end) {
      if (((uVar16 < order_end && order_begin <= uVar16) &&
          (sVar9 = WindowCursor::GetCell<short>(range_lo,0,uVar16), sVar8 <= sVar9)) &&
         (iVar24 = prev->start, sVar9 <= sVar8)) goto LAB_015cd6c3;
      uVar16 = prev->end;
      bVar7 = order_begin < uVar16;
      order_begin = iVar24;
      if ((uVar16 < order_end && bVar7) &&
         (sVar9 = WindowCursor::GetCell<short>(range_hi,0,uVar16 - 1), sVar9 <= sVar8)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(short,_short)>::function
              ((function<bool_(short,_short)> *)&first,(function<bool_(short,_short)> *)&comp);
    WVar28.pos = order_begin;
    WVar28.coll = range_lo;
    __last_00.pos = order_end;
    __last_00.coll = range_hi;
    WVar28 = ::std::
             lower_bound<duckdb::WindowColumnIterator<short>,short,duckdb::OperationCompare<short,duckdb::GreaterThan>>
                       (WVar28,__last_00,(short *)&val,
                        (OperationCompare<short,_duckdb::GreaterThan> *)&first);
    iVar24 = WVar28.pos;
    break;
  case UINT32:
    uVar12 = WindowInputExpression::GetCell<unsigned_int>(boundary,chunk_idx);
    _val = uVar12;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar13 = WindowCursor::GetCell<unsigned_int>(range_hi,0,order_end - 1);
      if (uVar12 < uVar13) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar13 = WindowCursor::GetCell<unsigned_int>(range_lo,0,order_begin);
      if (uVar13 < uVar12) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar16 = prev->start;
    if (uVar16 < prev->end) {
      if (uVar16 < order_end && order_begin <= uVar16) {
        uVar13 = WindowCursor::GetCell<unsigned_int>(range_lo,0,uVar16);
        if ((uVar12 <= uVar13) && (iVar24 = prev->start, uVar13 <= uVar12)) goto LAB_015cd6c3;
      }
      uVar16 = prev->end;
      bVar7 = order_begin < uVar16;
      order_begin = iVar24;
      if ((uVar16 < order_end && bVar7) &&
         (uVar13 = WindowCursor::GetCell<unsigned_int>(range_hi,0,uVar16 - 1), uVar13 <= uVar12)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(unsigned_int,_unsigned_int)>::function
              ((function<bool_(unsigned_int,_unsigned_int)> *)&first,
               (function<bool_(unsigned_int,_unsigned_int)> *)&comp);
    WVar29.pos = order_begin;
    WVar29.coll = range_lo;
    __last_01.pos = order_end;
    __last_01.coll = range_hi;
    WVar29 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_int>,unsigned_int,duckdb::OperationCompare<unsigned_int,duckdb::GreaterThan>>
                       (WVar29,__last_01,(uint *)&val,
                        (OperationCompare<unsigned_int,_duckdb::GreaterThan> *)&first);
    iVar24 = WVar29.pos;
    break;
  case INT32:
    iVar14 = WindowInputExpression::GetCell<int>(boundary,chunk_idx);
    _val = iVar14;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      iVar15 = WindowCursor::GetCell<int>(range_hi,0,order_end - 1);
      if (iVar14 < iVar15) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      iVar15 = WindowCursor::GetCell<int>(range_lo,0,order_begin);
      if (iVar15 < iVar14) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar16 = prev->start;
    if (uVar16 < prev->end) {
      if (((uVar16 < order_end && order_begin <= uVar16) &&
          (iVar15 = WindowCursor::GetCell<int>(range_lo,0,uVar16), iVar14 <= iVar15)) &&
         (iVar24 = prev->start, iVar15 <= iVar14)) goto LAB_015cd6c3;
      uVar16 = prev->end;
      bVar7 = order_begin < uVar16;
      order_begin = iVar24;
      if ((uVar16 < order_end && bVar7) &&
         (iVar15 = WindowCursor::GetCell<int>(range_hi,0,uVar16 - 1), iVar15 <= iVar14)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(int,_int)>::function
              ((function<bool_(int,_int)> *)&first,(function<bool_(int,_int)> *)&comp);
    WVar33.pos = order_begin;
    WVar33.coll = range_lo;
    __last_05.pos = order_end;
    __last_05.coll = range_hi;
    WVar33 = ::std::
             lower_bound<duckdb::WindowColumnIterator<int>,int,duckdb::OperationCompare<int,duckdb::GreaterThan>>
                       (WVar33,__last_05,(int *)&val,
                        (OperationCompare<int,_duckdb::GreaterThan> *)&first);
    iVar24 = WVar33.pos;
    break;
  case UINT64:
    uVar18 = WindowInputExpression::GetCell<unsigned_long>(boundary,chunk_idx);
    _val = (int)uVar18;
    auStack_77._3_4_ = (int)(uVar18 >> 0x20);
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar19 = WindowCursor::GetCell<unsigned_long>(range_hi,0,order_end - 1);
      if (uVar18 < uVar19) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar19 = WindowCursor::GetCell<unsigned_long>(range_lo,0,order_begin);
      if (uVar19 < uVar18) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar16 = prev->start;
    if (uVar16 < prev->end) {
      if (uVar16 < order_end && order_begin <= uVar16) {
        uVar19 = WindowCursor::GetCell<unsigned_long>(range_lo,0,uVar16);
        if ((uVar18 <= uVar19) && (iVar24 = prev->start, uVar19 <= uVar18)) goto LAB_015cd6c3;
      }
      uVar16 = prev->end;
      bVar7 = order_begin < uVar16;
      order_begin = iVar24;
      if ((uVar16 < order_end && bVar7) &&
         (uVar19 = WindowCursor::GetCell<unsigned_long>(range_hi,0,uVar16 - 1), uVar19 <= uVar18)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)&first,
               (function<bool_(unsigned_long,_unsigned_long)> *)&comp);
    WVar27.pos = order_begin;
    WVar27.coll = range_lo;
    __last.pos = order_end;
    __last.coll = range_hi;
    WVar27 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_long>,unsigned_long,duckdb::OperationCompare<unsigned_long,duckdb::GreaterThan>>
                       (WVar27,__last,(unsigned_long *)&val,
                        (OperationCompare<unsigned_long,_duckdb::GreaterThan> *)&first);
    iVar24 = WVar27.pos;
    break;
  case INT64:
    uVar20 = WindowInputExpression::GetCell<long>(boundary,chunk_idx);
    _val = (int)uVar20;
    auStack_77._3_4_ = (int)(uVar20 >> 0x20);
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      lVar21 = WindowCursor::GetCell<long>(range_hi,0,order_end - 1);
      if ((long)uVar20 < lVar21) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      lVar21 = WindowCursor::GetCell<long>(range_lo,0,order_begin);
      if (lVar21 < (long)uVar20) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&first,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar16 = prev->start;
    if (uVar16 < prev->end) {
      if (((uVar16 < order_end && order_begin <= uVar16) &&
          (lVar21 = WindowCursor::GetCell<long>(range_lo,0,uVar16), (long)uVar20 <= lVar21)) &&
         (iVar24 = prev->start, lVar21 <= (long)uVar20)) goto LAB_015cd6c3;
      uVar16 = prev->end;
      bVar7 = order_begin < uVar16;
      order_begin = iVar24;
      if ((uVar16 < order_end && bVar7) &&
         (lVar21 = WindowCursor::GetCell<long>(range_hi,0,uVar16 - 1), lVar21 <= (long)uVar20)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(long,_long)>::function
              ((function<bool_(long,_long)> *)&first,(function<bool_(long,_long)> *)&comp);
    WVar34.pos = order_begin;
    WVar34.coll = range_lo;
    __last_06.pos = order_end;
    __last_06.coll = range_hi;
    WVar34 = ::std::
             lower_bound<duckdb::WindowColumnIterator<long>,long,duckdb::OperationCompare<long,duckdb::GreaterThan>>
                       (WVar34,__last_06,(long *)&val,
                        (OperationCompare<long,_duckdb::GreaterThan> *)&first);
    iVar24 = WVar34.pos;
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_015cc1f3_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&comp,"Unsupported column type for RANGE",(allocator *)&first);
    InternalException::InternalException(this,(string *)&comp);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    fVar25 = WindowInputExpression::GetCell<float>(boundary,chunk_idx);
    _val = (int32_t)fVar25;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      cur_val.months = (int32_t)WindowCursor::GetCell<float>(range_hi,0,order_end - 1);
      bVar7 = GreaterThan::Operation<float>((float *)&cur_val,(float *)&val);
      if (bVar7) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&first,"Invalid RANGE PRECEDING value",&local_99);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cur_val.months = (int32_t)WindowCursor::GetCell<float>(range_lo,0,order_begin);
      bVar7 = GreaterThan::Operation<float>((float *)&val,(float *)&cur_val);
      if (bVar7) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&first,"Invalid RANGE FOLLOWING value",&local_99);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar16 = prev->start;
    uVar22 = prev->end;
    if (uVar16 < uVar22) {
      if (uVar16 < order_end && order_begin <= uVar16) {
        fVar25 = WindowCursor::GetCell<float>(range_lo,0,uVar16);
        first.months = (int32_t)fVar25;
        bVar7 = GreaterThan::Operation<float>((float *)&val,(float *)&first);
        if (!bVar7) {
          bVar7 = GreaterThan::Operation<float>((float *)&first,(float *)&val);
          iVar24 = prev->start;
          if (!bVar7) goto LAB_015cd6c3;
        }
        uVar22 = prev->end;
      }
      if (uVar22 < order_end && order_begin < uVar22) {
        fVar25 = WindowCursor::GetCell<float>(range_hi,0,uVar22 - 1);
        first.months = (int32_t)fVar25;
        bVar7 = GreaterThan::Operation<float>((float *)&first,(float *)&val);
        if (!bVar7) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(float,_float)>::function
              ((function<bool_(float,_float)> *)&first,(function<bool_(float,_float)> *)&comp);
    WVar38.pos = iVar24;
    WVar38.coll = range_lo;
    __last_10.pos = order_end;
    __last_10.coll = range_hi;
    WVar38 = ::std::
             lower_bound<duckdb::WindowColumnIterator<float>,float,duckdb::OperationCompare<float,duckdb::GreaterThan>>
                       (WVar38,__last_10,(float *)&val,
                        (OperationCompare<float,_duckdb::GreaterThan> *)&first);
    iVar24 = WVar38.pos;
    break;
  case DOUBLE:
    _val = WindowInputExpression::GetCell<double>(boundary,chunk_idx);
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      cur_val._0_8_ = WindowCursor::GetCell<double>(range_hi,0,order_end - 1);
      bVar7 = GreaterThan::Operation<double>((double *)&cur_val,(double *)&val);
      if (bVar7) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&first,"Invalid RANGE PRECEDING value",&local_99);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cur_val._0_8_ = WindowCursor::GetCell<double>(range_lo,0,order_begin);
      bVar7 = GreaterThan::Operation<double>((double *)&val,(double *)&cur_val);
      if (bVar7) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&first,"Invalid RANGE FOLLOWING value",&local_99);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar16 = prev->start;
    uVar22 = prev->end;
    if (uVar16 < uVar22) {
      if (uVar16 < order_end && order_begin <= uVar16) {
        first._0_8_ = WindowCursor::GetCell<double>(range_lo,0,uVar16);
        bVar7 = GreaterThan::Operation<double>((double *)&val,(double *)&first);
        if (!bVar7) {
          bVar7 = GreaterThan::Operation<double>((double *)&first,(double *)&val);
          iVar24 = prev->start;
          if (!bVar7) goto LAB_015cd6c3;
        }
        uVar22 = prev->end;
      }
      if (uVar22 < order_end && order_begin < uVar22) {
        dVar2 = WindowCursor::GetCell<double>(range_hi,0,uVar22 - 1);
        first._0_8_ = dVar2;
        bVar7 = GreaterThan::Operation<double>((double *)&first,(double *)&val);
        if (!bVar7) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(double,_double)>::function
              ((function<bool_(double,_double)> *)&first,(function<bool_(double,_double)> *)&comp);
    WVar37.pos = iVar24;
    WVar37.coll = range_lo;
    __last_09.pos = order_end;
    __last_09.coll = range_hi;
    WVar37 = ::std::
             lower_bound<duckdb::WindowColumnIterator<double>,double,duckdb::OperationCompare<double,duckdb::GreaterThan>>
                       (WVar37,__last_09,(double *)&val,
                        (OperationCompare<double,_duckdb::GreaterThan> *)&first);
    iVar24 = WVar37.pos;
    break;
  case INTERVAL:
    _val = WindowInputExpression::GetCell<duckdb::interval_t>(boundary,chunk_idx);
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      cur_val = WindowCursor::GetCell<duckdb::interval_t>(range_hi,0,order_end - 1);
      bVar7 = interval_t::operator>(&cur_val,(interval_t *)&val);
      if (bVar7) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&first,"Invalid RANGE PRECEDING value",&local_99);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cur_val = WindowCursor::GetCell<duckdb::interval_t>(range_lo,0,order_begin);
      bVar7 = interval_t::operator>((interval_t *)&val,&cur_val);
      if (bVar7) {
        pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&first,"Invalid RANGE FOLLOWING value",&local_99);
        OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
        __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar16 = prev->start;
    uVar22 = prev->end;
    if (uVar16 < uVar22) {
      if (uVar16 < order_end && order_begin <= uVar16) {
        first = WindowCursor::GetCell<duckdb::interval_t>(range_lo,0,uVar16);
        bVar7 = interval_t::operator>((interval_t *)&val,&first);
        if (!bVar7) {
          bVar7 = interval_t::operator>(&first,(interval_t *)&val);
          iVar24 = prev->start;
          if (!bVar7) goto LAB_015cd6c3;
        }
        uVar22 = prev->end;
      }
      if (uVar22 < order_end && order_begin < uVar22) {
        first = WindowCursor::GetCell<duckdb::interval_t>(range_hi,0,uVar22 - 1);
        bVar7 = interval_t::operator>(&first,(interval_t *)&val);
        if (!bVar7) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(duckdb::interval_t,_duckdb::interval_t)>::function
              ((function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&first,
               (function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&comp);
    WVar36.pos = iVar24;
    WVar36.coll = range_lo;
    __last_08.pos = order_end;
    __last_08.coll = range_hi;
    WVar36 = ::std::
             lower_bound<duckdb::WindowColumnIterator<duckdb::interval_t>,duckdb::interval_t,duckdb::OperationCompare<duckdb::interval_t,duckdb::GreaterThan>>
                       (WVar36,__last_08,(interval_t *)&val,
                        (OperationCompare<duckdb::interval_t,_duckdb::GreaterThan> *)&first);
    iVar24 = WVar36.pos;
    break;
  default:
    if (PVar1 == UINT128) {
      _val = (interval_t)WindowInputExpression::GetCell<duckdb::uhugeint_t>(boundary,chunk_idx);
      comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
           (_Manager_type)0x0;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
      _M_unused._M_object = (void *)0x0;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_
           = 0;
      if (range == EXPR_PRECEDING_RANGE) {
        cur_val = (interval_t)WindowCursor::GetCell<duckdb::uhugeint_t>(range_hi,0,order_end - 1);
        bVar7 = uhugeint_t::operator>((uhugeint_t *)&cur_val,(uhugeint_t *)&val);
        if (bVar7) {
          pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string((string *)&first,"Invalid RANGE PRECEDING value",&local_99)
          ;
          OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
          __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        cur_val = (interval_t)WindowCursor::GetCell<duckdb::uhugeint_t>(range_lo,0,order_begin);
        bVar7 = uhugeint_t::operator>((uhugeint_t *)&val,(uhugeint_t *)&cur_val);
        if (bVar7) {
          pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string((string *)&first,"Invalid RANGE FOLLOWING value",&local_99)
          ;
          OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
          __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      uVar16 = prev->start;
      uVar22 = prev->end;
      if (uVar16 < uVar22) {
        if (uVar16 < order_end && order_begin <= uVar16) {
          first = (interval_t)WindowCursor::GetCell<duckdb::uhugeint_t>(range_lo,0,uVar16);
          bVar7 = uhugeint_t::operator>((uhugeint_t *)&val,(uhugeint_t *)&first);
          if (!bVar7) {
            bVar7 = uhugeint_t::operator>((uhugeint_t *)&first,(uhugeint_t *)&val);
            iVar24 = prev->start;
            if (!bVar7) goto LAB_015cd6c3;
          }
          uVar22 = prev->end;
        }
        if (uVar22 < order_end && order_begin < uVar22) {
          first = (interval_t)WindowCursor::GetCell<duckdb::uhugeint_t>(range_hi,0,uVar22 - 1);
          bVar7 = uhugeint_t::operator>((uhugeint_t *)&first,(uhugeint_t *)&val);
          if (!bVar7) {
            order_end = prev->end + 1;
          }
        }
      }
      ::std::function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)>::function
                ((function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&first,
                 (function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&comp);
      WVar39.pos = iVar24;
      WVar39.coll = range_lo;
      __last_11.pos = order_end;
      __last_11.coll = range_hi;
      WVar39 = ::std::
               lower_bound<duckdb::WindowColumnIterator<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::OperationCompare<duckdb::uhugeint_t,duckdb::GreaterThan>>
                         (WVar39,__last_11,(uhugeint_t *)&val,
                          (OperationCompare<duckdb::uhugeint_t,_duckdb::GreaterThan> *)&first);
      iVar24 = WVar39.pos;
    }
    else {
      if (PVar1 != INT128) goto switchD_015cc1f3_caseD_a;
      _val = (interval_t)WindowInputExpression::GetCell<duckdb::hugeint_t>(boundary,chunk_idx);
      lVar21 = val._8_8_;
      uVar16 = (ulong)val;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
           (_Manager_type)0x0;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
      _M_unused._M_object = (void *)0x0;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_
           = 0;
      if (range == EXPR_PRECEDING_RANGE) {
        hVar26 = WindowCursor::GetCell<duckdb::hugeint_t>(range_hi,0,order_end - 1);
        if ((lVar21 < hVar26.upper) || (uVar16 < hVar26.lower && hVar26.upper == lVar21)) {
          pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&first,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
          OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
          __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        hVar26 = WindowCursor::GetCell<duckdb::hugeint_t>(range_lo,0,order_begin);
        if ((hVar26.upper < lVar21) || (hVar26.lower < uVar16 && lVar21 == hVar26.upper)) {
          pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&first,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
          OutOfRangeException::OutOfRangeException(pOVar17,(string *)&first);
          __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      uVar22 = prev->start;
      if (uVar22 < prev->end) {
        if (uVar22 < order_end && order_begin <= uVar22) {
          hVar26 = WindowCursor::GetCell<duckdb::hugeint_t>(range_lo,0,uVar22);
          lVar23 = hVar26.upper;
          if ((lVar21 <= lVar23) && (uVar16 <= hVar26.lower || lVar21 != lVar23)) {
            iVar24 = prev->start;
            if ((lVar23 <= lVar21) && (hVar26.lower <= uVar16 || lVar21 != lVar23))
            goto LAB_015cd6c3;
          }
        }
        uVar22 = prev->end;
        bVar7 = order_begin < uVar22;
        order_begin = iVar24;
        if (uVar22 < order_end && bVar7) {
          hVar26 = WindowCursor::GetCell<duckdb::hugeint_t>(range_hi,0,uVar22 - 1);
          if ((hVar26.upper <= lVar21) && (hVar26.lower <= uVar16 || hVar26.upper != lVar21)) {
            order_end = prev->end + 1;
          }
        }
      }
      ::std::function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)>::function
                ((function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&first,
                 (function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&comp);
      WVar35.pos = order_begin;
      WVar35.coll = range_lo;
      __last_07.pos = order_end;
      __last_07.coll = range_hi;
      WVar35 = ::std::
               lower_bound<duckdb::WindowColumnIterator<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::OperationCompare<duckdb::hugeint_t,duckdb::GreaterThan>>
                         (WVar35,__last_07,(hugeint_t *)&val,
                          (OperationCompare<duckdb::hugeint_t,_duckdb::GreaterThan> *)&first);
      iVar24 = WVar35.pos;
    }
  }
  ::std::_Function_base::~_Function_base((_Function_base *)&first);
LAB_015cd6c3:
  ::std::_Function_base::~_Function_base((_Function_base *)&comp);
  return iVar24;
}

Assistant:

static idx_t FindRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const idx_t order_begin,
                            const idx_t order_end, const WindowBoundary range, WindowInputExpression &boundary,
                            const idx_t chunk_idx, const FrameBounds &prev) {
	switch (boundary.InternalType()) {
	case PhysicalType::INT8:
		return FindTypedRangeBound<int8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INT16:
		return FindTypedRangeBound<int16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT32:
		return FindTypedRangeBound<int32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT64:
		return FindTypedRangeBound<int64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT8:
		return FindTypedRangeBound<uint8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT16:
		return FindTypedRangeBound<uint16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT32:
		return FindTypedRangeBound<uint32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT64:
		return FindTypedRangeBound<uint64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::INT128:
		return FindTypedRangeBound<hugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                chunk_idx, prev);
	case PhysicalType::UINT128:
		return FindTypedRangeBound<uhugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	case PhysicalType::FLOAT:
		return FindTypedRangeBound<float, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                            chunk_idx, prev);
	case PhysicalType::DOUBLE:
		return FindTypedRangeBound<double, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INTERVAL:
		return FindTypedRangeBound<interval_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	default:
		throw InternalException("Unsupported column type for RANGE");
	}
}